

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O3

uint64 __thiscall
dlib::thread_pool_implementation::make_next_task_id(thread_pool_implementation *this,long idx)

{
  task_state_type *ptVar1;
  size_t sVar2;
  uint64 uVar3;
  
  ptVar1 = (this->tasks).array_elements;
  sVar2 = (this->tasks).array_size;
  uVar3 = ptVar1[idx].next_task_id;
  ptVar1[idx].next_task_id = uVar3 + 1;
  return sVar2 * uVar3 + idx;
}

Assistant:

T& array<T,mem_manager>::
    operator[] (
        size_t pos
    ) 
    {
        // make sure requires clause is not broken
        DLIB_ASSERT( pos < this->size() , 
            "\tT& array::operator[]"
            << "\n\tpos must be < size()" 
            << "\n\tpos: " << pos 
            << "\n\tsize(): " << this->size()
            << "\n\tthis: " << this
            );

        return array_elements[pos];
    }